

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O0

Vec_Int_t * Unm_ManComputePairs(Unm_Man_t *p,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Hash_IntMan_t *pHash_00;
  int *piVar3;
  int t;
  int nRefs;
  int Num;
  int FanJ;
  int FanK;
  int j;
  int k;
  int i;
  int nPairs;
  int nPairs0;
  int nTotal;
  Hash_IntMan_t *pHash;
  Vec_Int_t *vNum2Obj;
  Vec_Int_t *vPairs;
  Gia_Obj_t *pObj;
  int fVerbose_local;
  Unm_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(1000);
  p_01 = Vec_IntStart(1);
  pHash_00 = Hash_IntManStart(1000);
  nPairs = 0;
  i = 0;
  Gia_ManSetRefsMapped(p->pGia);
  j = 1;
  do {
    iVar1 = Gia_ManObjNum(p->pGia);
    if (iVar1 <= j) {
      Vec_IntFree(p_01);
      if (fVerbose != 0) {
        iVar1 = Vec_IntSize(p_00);
        Unm_ManPrintPairStats(pHash_00,nPairs,i,iVar1 / 3,0);
      }
      Hash_IntManStop(pHash_00);
      return p_00;
    }
    iVar1 = Gia_ObjIsLut(p->pGia,j);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjLutSize(p->pGia,j);
      iVar2 = Gia_ObjLutSize(p->pGia,j);
      nPairs = (iVar1 * (iVar2 + -1)) / 2 + nPairs;
      Gia_ManObj(p->pGia,j);
      Vec_IntClear(p->vLeaves);
      for (FanK = 0; iVar1 = Gia_ObjLutSize(p->pGia,j), FanK < iVar1; FanK = FanK + 1) {
        piVar3 = Gia_ObjLutFanins(p->pGia,j);
        iVar1 = piVar3[FanK];
        iVar2 = Gia_ObjRefNumId(p->pGia,iVar1);
        if (1 < iVar2) {
          Vec_IntPush(p->vLeaves,iVar1);
        }
      }
      iVar1 = Vec_IntSize(p->vLeaves);
      if (1 < iVar1) {
        iVar1 = Vec_IntSize(p->vLeaves);
        iVar2 = Vec_IntSize(p->vLeaves);
        i = (iVar1 * (iVar2 + -1)) / 2 + i;
        for (FanK = 0; iVar1 = Vec_IntSize(p->vLeaves), FanK < iVar1; FanK = FanK + 1) {
          Num = Vec_IntEntry(p->vLeaves,FanK);
          FanJ = FanK;
          while( true ) {
            FanJ = FanJ + 1;
            iVar1 = Vec_IntSize(p->vLeaves);
            if (iVar1 <= FanJ) break;
            iVar1 = Vec_IntEntry(p->vLeaves,FanJ);
            nRefs = iVar1;
            if (iVar1 < Num) {
              nRefs = Num;
              Num = iVar1;
            }
            iVar1 = Hash_Int2ManInsert(pHash_00,Num,nRefs,0);
            iVar2 = Hash_Int2ObjInc(pHash_00,iVar1);
            if (iVar2 == 0) {
              iVar2 = Hash_IntManEntryNum(pHash_00);
              if (iVar1 != iVar2) {
                __assert_fail("Num == Hash_IntManEntryNum(pHash)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink7.c"
                              ,0xb8,"Vec_Int_t *Unm_ManComputePairs(Unm_Man_t *, int)");
              }
              iVar2 = Vec_IntSize(p_01);
              if (iVar1 != iVar2) {
                __assert_fail("Num == Vec_IntSize(vNum2Obj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink7.c"
                              ,0xb9,"Vec_Int_t *Unm_ManComputePairs(Unm_Man_t *, int)");
              }
              Vec_IntPush(p_01,j);
            }
            else {
              if (iVar2 == 1) {
                iVar2 = Vec_IntSize(p_01);
                if (iVar2 <= iVar1) {
                  __assert_fail("Num < Vec_IntSize(vNum2Obj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink7.c"
                                ,0xbf,"Vec_Int_t *Unm_ManComputePairs(Unm_Man_t *, int)");
                }
                iVar1 = Vec_IntEntry(p_01,iVar1);
                Vec_IntPush(p_00,iVar1);
                Vec_IntPush(p_00,Num);
                Vec_IntPush(p_00,nRefs);
              }
              Vec_IntPush(p_00,j);
              Vec_IntPush(p_00,Num);
              Vec_IntPush(p_00,nRefs);
            }
          }
        }
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Unm_ManComputePairs( Unm_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vPairs = Vec_IntAlloc( 1000 );
    Vec_Int_t * vNum2Obj = Vec_IntStart( 1 );
    Hash_IntMan_t * pHash = Hash_IntManStart( 1000 );
    int nTotal = 0, nPairs0 = 0, nPairs = 0;
    int i, k, j, FanK, FanJ, Num, nRefs;
    Gia_ManSetRefsMapped( p->pGia );
    Gia_ManForEachLut( p->pGia, i )
    {
        nTotal += Gia_ObjLutSize(p->pGia, i) * (Gia_ObjLutSize(p->pGia, i) - 1) / 2;
        pObj = Gia_ManObj( p->pGia, i );
        // collect leaves of this gate  
        Vec_IntClear( p->vLeaves );
        Gia_LutForEachFanin( p->pGia, i, Num, k )
            if ( Gia_ObjRefNumId(p->pGia, Num) > 1 )
                Vec_IntPush( p->vLeaves, Num );
        if ( Vec_IntSize(p->vLeaves) < 2 )
            continue;
        nPairs0 += Vec_IntSize(p->vLeaves) * (Vec_IntSize(p->vLeaves) - 1) / 2;
        // enumerate pairs
        Vec_IntForEachEntry( p->vLeaves, FanK, k )
        Vec_IntForEachEntryStart( p->vLeaves, FanJ, j, k+1 )
        {
            if ( FanK > FanJ )
                ABC_SWAP( int, FanK, FanJ );
            Num = Hash_Int2ManInsert( pHash, FanK, FanJ, 0 );
            nRefs = Hash_Int2ObjInc(pHash, Num);
            if ( nRefs == 0 )
            {
                assert( Num == Hash_IntManEntryNum(pHash) );
                assert( Num == Vec_IntSize(vNum2Obj) );
                Vec_IntPush( vNum2Obj, i );
                continue;
            }
            if ( nRefs == 1 )
            {
                assert( Num < Vec_IntSize(vNum2Obj) );
                Vec_IntPush( vPairs, Vec_IntEntry(vNum2Obj, Num) );
                Vec_IntPush( vPairs, FanK );
                Vec_IntPush( vPairs, FanJ);
            }
            Vec_IntPush( vPairs, i );
            Vec_IntPush( vPairs, FanK );
            Vec_IntPush( vPairs, FanJ );
        }
    }
    Vec_IntFree( vNum2Obj );
    if ( fVerbose )
        nPairs = Unm_ManPrintPairStats( pHash, nTotal, nPairs0, Vec_IntSize(vPairs) / 3, 0 );
    Hash_IntManStop( pHash );
    return vPairs;    
}